

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_combo_begin_symbol(nk_context *ctx,nk_symbol_type symbol,nk_vec2 size)

{
  float fVar1;
  nk_window *win_00;
  nk_rect content_00;
  nk_rect r;
  nk_rect r_00;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect header_00;
  nk_widget_layout_states nVar2;
  int iVar3;
  float fVar4;
  nk_context *local_a8;
  nk_symbol_type local_a0;
  nk_symbol_type sym;
  nk_rect button;
  nk_rect content;
  nk_rect bounds;
  nk_color local_64;
  nk_color symbol_color;
  nk_color sym_background;
  nk_style_item *background;
  nk_widget_layout_states s;
  int is_clicked;
  nk_rect header;
  nk_input *in;
  nk_style *style;
  nk_window *win;
  nk_symbol_type symbol_local;
  nk_context *ctx_local;
  nk_vec2 size_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x59cb,
                  "int nk_combo_begin_symbol(struct nk_context *, enum nk_symbol_type, struct nk_vec2)"
                 );
  }
  if (ctx->current != (nk_window *)0x0) {
    if (ctx->current->layout != (nk_panel *)0x0) {
      if (((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
         (ctx->current->layout == (nk_panel *)0x0)) {
        size_local.x = 0.0;
      }
      else {
        win_00 = ctx->current;
        nVar2 = nk_widget((nk_rect *)&s,ctx);
        if (nVar2 == NK_WIDGET_INVALID) {
          size_local.x = 0.0;
        }
        else {
          if (((win_00->layout->flags & 0x1000) != 0) || (local_a8 = ctx, nVar2 == NK_WIDGET_ROM)) {
            local_a8 = (nk_context *)0x0;
          }
          header._8_8_ = local_a8;
          r.y = (float)is_clicked;
          r.x = (float)s;
          r.w = header.x;
          r.h = header.y;
          iVar3 = nk_button_behavior(&ctx->last_widget_state,r,&local_a8->input,NK_BUTTON_DEFAULT);
          background._4_4_ = (uint)(iVar3 != 0);
          if ((ctx->last_widget_state & 0x20) == 0) {
            if ((ctx->last_widget_state & 0x10) == 0) {
              _symbol_color = &(ctx->style).combo;
              bounds.h = *(float *)&(ctx->style).combo.symbol_hover;
            }
            else {
              _symbol_color = (nk_style_combo *)&(ctx->style).combo.hover;
              bounds.h = *(float *)&(ctx->style).combo.symbol_hover;
            }
          }
          else {
            _symbol_color = (nk_style_combo *)&(ctx->style).combo.active;
            bounds.h = *(float *)&(ctx->style).combo.symbol_active;
          }
          if ((_symbol_color->normal).type == NK_STYLE_ITEM_IMAGE) {
            local_64 = nk_rgba(0,0,0,0);
            r_00.y = (float)is_clicked;
            r_00.x = (float)s;
            r_00.w = header.x;
            r_00.h = header.y;
            nk_draw_image(&win_00->buffer,r_00,&(_symbol_color->normal).data.image,
                          (nk_color)0xffffffff);
          }
          else {
            local_64 = (_symbol_color->normal).data.color;
            rect.y = (float)is_clicked;
            rect.x = (float)s;
            rect.w = header.x;
            rect.h = header.y;
            nk_fill_rect(&win_00->buffer,rect,(ctx->style).combo.rounding,
                         (_symbol_color->normal).data.color);
            rect_00.y = (float)is_clicked;
            rect_00.x = (float)s;
            rect_00.w = header.x;
            rect_00.h = header.y;
            nk_stroke_rect(&win_00->buffer,rect_00,(ctx->style).combo.rounding,
                           (ctx->style).combo.border,(ctx->style).combo.border_color);
          }
          memset(&content.w,0,0x10);
          if ((ctx->last_widget_state & 0x10) == 0) {
            if (background._4_4_ == 0) {
              local_a0 = (ctx->style).combo.sym_normal;
            }
            else {
              local_a0 = (ctx->style).combo.sym_active;
            }
          }
          else {
            local_a0 = (ctx->style).combo.sym_hover;
          }
          fVar1 = (ctx->style).combo.button_padding.y;
          button.x = header.y - (fVar1 + fVar1);
          fVar4 = (((float)s + header.x) - header.y) - (ctx->style).combo.button_padding.y;
          button.w = fVar4 + (ctx->style).combo.button.padding.x;
          button.h = (float)is_clicked + (ctx->style).combo.button_padding.y +
                     (ctx->style).combo.button.padding.y;
          fVar1 = (ctx->style).combo.button.padding.x;
          content.x = button.x - (fVar1 + fVar1);
          fVar1 = (ctx->style).combo.button.padding.y;
          content.y = button.x - (fVar1 + fVar1);
          fVar1 = (ctx->style).combo.content_padding.y;
          content.h = (float)is_clicked + (ctx->style).combo.content_padding.y;
          content.w = (float)s + (ctx->style).combo.content_padding.x;
          content_00.y = content.h;
          content_00.x = content.w;
          content_00.w = (fVar4 - (ctx->style).combo.content_padding.y) - content.w;
          content_00.h = header.y - (fVar1 + fVar1);
          button.y = button.x;
          nk_draw_symbol(&win_00->buffer,symbol,content_00,local_64,(nk_color)bounds.h,1.0,
                         (ctx->style).font);
          nk_draw_button_symbol
                    (&win_00->buffer,(nk_rect *)&content.w,(nk_rect *)&button.w,
                     ctx->last_widget_state,&(ctx->style).combo.button,local_a0,(ctx->style).font);
          header_00.y = (float)is_clicked;
          header_00.x = (float)s;
          header_00.w = header.x;
          header_00.h = header.y;
          size_local.x = (float)nk_combo_begin(ctx,win_00,size,background._4_4_,header_00);
        }
      }
      return (int)size_local.x;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x59cd,
                  "int nk_combo_begin_symbol(struct nk_context *, enum nk_symbol_type, struct nk_vec2)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x59cc,
                "int nk_combo_begin_symbol(struct nk_context *, enum nk_symbol_type, struct nk_vec2)"
               );
}

Assistant:

NK_API int
nk_combo_begin_symbol(struct nk_context *ctx, enum nk_symbol_type symbol, struct nk_vec2 size)
{
    struct nk_window *win;
    struct nk_style *style;
    const struct nk_input *in;

    struct nk_rect header;
    int is_clicked = nk_false;
    enum nk_widget_layout_states s;
    const struct nk_style_item *background;
    struct nk_color sym_background;
    struct nk_color symbol_color;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    s = nk_widget(&header, ctx);
    if (s == NK_WIDGET_INVALID)
        return 0;

    in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
    if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
        is_clicked = nk_true;

    /* draw combo box header background and border */
    if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED) {
        background = &style->combo.active;
        symbol_color = style->combo.symbol_active;
    } else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER) {
        background = &style->combo.hover;
        symbol_color = style->combo.symbol_hover;
    } else {
        background = &style->combo.normal;
        symbol_color = style->combo.symbol_hover;
    }

    if (background->type == NK_STYLE_ITEM_IMAGE) {
        sym_background = nk_rgba(0,0,0,0);
        nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
    } else {
        sym_background = background->data.color;
        nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
        nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
    }
    {
        struct nk_rect bounds = {0,0,0,0};
        struct nk_rect content;
        struct nk_rect button;

        enum nk_symbol_type sym;
        if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
            sym = style->combo.sym_hover;
        else if (is_clicked)
            sym = style->combo.sym_active;
        else sym = style->combo.sym_normal;

        /* calculate button */
        button.w = header.h - 2 * style->combo.button_padding.y;
        button.x = (header.x + header.w - header.h) - style->combo.button_padding.y;
        button.y = header.y + style->combo.button_padding.y;
        button.h = button.w;

        content.x = button.x + style->combo.button.padding.x;
        content.y = button.y + style->combo.button.padding.y;
        content.w = button.w - 2 * style->combo.button.padding.x;
        content.h = button.h - 2 * style->combo.button.padding.y;

        /* draw symbol */
        bounds.h = header.h - 2 * style->combo.content_padding.y;
        bounds.y = header.y + style->combo.content_padding.y;
        bounds.x = header.x + style->combo.content_padding.x;
        bounds.w = (button.x - style->combo.content_padding.y) - bounds.x;
        nk_draw_symbol(&win->buffer, symbol, bounds, sym_background, symbol_color,
            1.0f, style->font);

        /* draw open/close button */
        nk_draw_button_symbol(&win->buffer, &bounds, &content, ctx->last_widget_state,
            &ctx->style.combo.button, sym, style->font);
    }
    return nk_combo_begin(ctx, win, size, is_clicked, header);
}